

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_> __thiscall
perfetto::base::UnixSocket::Listen
          (UnixSocket *this,string *socket_name,EventListener *event_listener,
          TaskRunner *task_runner,SockFamily sock_family,SockType sock_type)

{
  bool bVar1;
  UnixSocketRaw sock_raw;
  ScopedSocketHandle local_4c;
  UnixSocketRaw local_48;
  TaskRunner *local_38;
  
  local_38 = task_runner;
  UnixSocketRaw::CreateMayFail(&local_48,sock_family,sock_type);
  if (local_48.fd_.t_ != -1) {
    bVar1 = UnixSocketRaw::Bind(&local_48,socket_name);
    if (bVar1) {
      local_4c.t_ = local_48.fd_.t_;
      local_48.fd_.t_ = -1;
      Listen(this,&local_4c,event_listener,local_38,sock_family,sock_type);
      ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
      ::reset(&local_4c,-1);
      goto LAB_002cde25;
    }
  }
  (this->sock_raw_).fd_ = 0;
  (this->sock_raw_).family_ = 0;
LAB_002cde25:
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::reset(&local_48.fd_,-1);
  return (__uniq_ptr_data<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>,_true,_true>
          )(__uniq_ptr_data<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<UnixSocket> UnixSocket::Listen(const std::string& socket_name,
                                               EventListener* event_listener,
                                               TaskRunner* task_runner,
                                               SockFamily sock_family,
                                               SockType sock_type) {
  auto sock_raw = UnixSocketRaw::CreateMayFail(sock_family, sock_type);
  if (!sock_raw || !sock_raw.Bind(socket_name))
    return nullptr;

  // Forward the call to the Listen() overload below.
  return Listen(sock_raw.ReleaseFd(), event_listener, task_runner, sock_family,
                sock_type);
}